

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moduleexecutors.cpp
# Opt level: O2

bool __thiscall
trun::TestModuleExecutorSequential::Execute
          (TestModuleExecutorSequential *this,Ref *library,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
          *testModules)

{
  value_type *pvVar1;
  pointer psVar2;
  bool bVar3;
  bool bVar4;
  kRunResultAction kVar5;
  ILogger *pIVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  Config *pCVar9;
  long lVar10;
  pointer __str;
  pointer psVar11;
  __shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
  _Var13;
  __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
  __first;
  __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
  __i;
  long lVar14;
  pointer psVar15;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  matches;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  testModulesList;
  Ref result;
  Ref local_e8;
  __shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Ref *local_a8;
  __shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> local_90;
  value_type tmToRemove;
  __shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argModuleName;
  __shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_a8 = library;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"TestModExeSeq",(allocator<char> *)&argModuleName);
  pIVar6 = gnilk::Logger::GetLogger((string *)&result);
  *(ILogger **)&this->field_0x8 = pIVar6;
  std::__cxx11::string::~string((string *)&result);
  testModulesList.
  super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  testModulesList.
  super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testModulesList.
  super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var7 = (testModules->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      psVar11 = testModulesList.
                super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      psVar2 = testModulesList.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      (_Rb_tree_header *)p_Var7 != &(testModules->_M_t)._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    std::
    vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>::
    push_back(&testModulesList,(value_type *)(p_Var7 + 2));
  }
  if (testModulesList.
      super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      testModulesList.
      super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar14 = (long)testModulesList.
                   super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)testModulesList.
                   super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = lVar14 >> 4;
    lVar10 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
              (testModulesList.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               testModulesList.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar14 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,__gnu_cxx::__ops::_Iter_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
                (psVar2,psVar11);
    }
    else {
      psVar15 = psVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,__gnu_cxx::__ops::_Iter_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
                (psVar2,psVar15);
      for (; psVar15 != psVar11; psVar15 = psVar15 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,__gnu_cxx::__ops::_Val_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
                  (psVar15);
      }
    }
  }
  pCVar9 = Config::Instance();
  __str = (pCVar9->modules).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_b8._M_allocated_capacity =
       (size_type)
       (pCVar9->modules).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__str == (pointer)local_b8._M_allocated_capacity) {
      std::
      vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ::~vector(&testModulesList);
      return true;
    }
    local_b8._8_8_ = __str;
    std::__cxx11::string::string((string *)&argModuleName,__str);
    psVar2 = testModulesList.
             super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    matches.
    super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    matches.
    super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    matches.
    super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar4 = false;
    for (psVar11 = testModulesList.
                   super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar2;
        psVar11 = psVar11 + 1) {
      bVar3 = std::operator==(&argModuleName,"-");
      if (bVar3) {
        std::
        vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
        ::push_back(&matches,psVar11);
      }
      else if (*argModuleName._M_dataplus._M_p == '!') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &argModuleName,1,0xffffffffffffffff);
        bVar3 = match(&((psVar11->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->name,(string *)&result);
        if (bVar3) {
          std::
          vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
          ::push_back(&matches,psVar11);
          bVar4 = true;
        }
        std::__cxx11::string::~string((string *)&result);
        if (bVar3) break;
      }
      else {
        bVar3 = match(&((psVar11->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->name,&argModuleName);
        if (bVar3) {
          std::
          vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
          ::push_back(&matches,psVar11);
          goto LAB_0011cdca;
        }
      }
    }
    if (bVar4) {
      if ((long)matches.
                super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)matches.
                super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x10) {
        __assert_fail("matches.size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/moduleexecutors.cpp"
                      ,0x86,
                      "virtual bool trun::TestModuleExecutorSequential::Execute(const IDynLibrary::Ref &, const std::map<std::string, TestModule::Ref> &)"
                     );
      }
      std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&tmToRemove.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>,
                 &(matches.
                   super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,
                 &tmToRemove.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>);
      psVar2 = testModulesList.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      _Var13._M_current =
           testModulesList.
           super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = (long)testModulesList.
                     super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)testModulesList.
                     super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,&local_90);
      std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_d8,&local_70);
      local_c8._M_refcount._M_pi = local_d8._M_refcount._M_pi;
      local_c8._M_ptr = local_d8._M_ptr;
      local_d8._M_ptr = (element_type *)0x0;
      local_d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&local_c8);
      std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)&result,&local_40);
      for (lVar10 = lVar14 >> 6; 0 < lVar10; lVar10 = lVar10 + -1) {
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                              *)&result,_Var13);
        __first._M_current = _Var13._M_current;
        if (bVar4) goto LAB_0011ced0;
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                              *)&result,_Var13._M_current + 1);
        __first._M_current = _Var13._M_current + 1;
        if (bVar4) goto LAB_0011ced0;
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                              *)&result,_Var13._M_current + 2);
        __first._M_current = _Var13._M_current + 2;
        if (bVar4) goto LAB_0011ced0;
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                              *)&result,_Var13._M_current + 3);
        __first._M_current = _Var13._M_current + 3;
        if (bVar4) goto LAB_0011ced0;
        _Var13._M_current = _Var13._M_current + 4;
        lVar14 = lVar14 + -0x40;
      }
      lVar14 = lVar14 >> 4;
      if (lVar14 == 1) {
LAB_0011cfb6:
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                              *)&result,_Var13);
        __first._M_current = _Var13._M_current;
        if (!bVar4) {
          __first._M_current = psVar2;
        }
      }
      else if (lVar14 == 2) {
LAB_0011cf9e:
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                              *)&result,_Var13);
        __first._M_current = _Var13._M_current;
        if (!bVar4) {
          _Var13._M_current = _Var13._M_current + 1;
          goto LAB_0011cfb6;
        }
      }
      else {
        __first._M_current = psVar2;
        if ((lVar14 == 3) &&
           (bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                    ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                  *)&result,_Var13), __first._M_current = _Var13._M_current, !bVar4)
           ) {
          _Var13._M_current = _Var13._M_current + 1;
          goto LAB_0011cf9e;
        }
      }
LAB_0011ced0:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      _Var13._M_current = __first._M_current;
      if (__first._M_current != psVar2) {
        while (_Var13._M_current =
                    (shared_ptr<trun::TestModule> *)
                    (&(_Var13._M_current)->
                      super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> + 1),
              _Var13._M_current != psVar2) {
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                  ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                *)&local_c8,_Var13);
          if (!bVar4) {
            std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(__first._M_current)->
                        super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)
                       _Var13._M_current);
            __first._M_current =
                 (shared_ptr<trun::TestModule> *)
                 (&(__first._M_current)->
                   super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> + 1);
          }
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
      std::
      vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ::erase(&testModulesList,(const_iterator)__first._M_current,
              (const_iterator)
              testModulesList.
              super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      pvVar1 = &tmToRemove;
LAB_0011cf6e:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(pvVar1->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
    }
    else {
LAB_0011cdca:
      psVar2 = matches.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var12 = &(matches.
                       super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>;
          p_Var12 != &psVar2->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>;
          p_Var12 = p_Var12 + 1) {
        if (p_Var12->_M_ptr->state == Idle) {
          gnilk::Log::Info<char_const*,char_const*>
                    (*(Log **)&this->field_0x8,"Executing tests for library: %s",
                     (p_Var12->_M_ptr->name)._M_dataplus._M_p);
          std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_a0,p_Var12);
          TestRunner::SetCurrentTestModule((Ref *)&local_a0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
          TestModule::Execute((TestModule *)&result,(Ref *)p_Var12->_M_ptr);
          if ((result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0) &&
             (kVar5 = TestResult::CheckIfContinue
                                (result.
                                 super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr), kVar5 == kAbortAll)) {
            pvVar1 = (value_type *)&result;
            goto LAB_0011cf6e;
          }
          local_e8.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_e8.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          TestRunner::SetCurrentTestModule(&local_e8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_e8.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
    }
    std::
    vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>::
    ~vector(&matches);
    std::__cxx11::string::~string((string *)&argModuleName);
    __str = (pointer)(local_b8._8_8_ + 0x20);
  } while( true );
}

Assistant:

bool TestModuleExecutorSequential::Execute(const IDynLibrary::Ref &library, const std::map<std::string, TestModule::Ref> &testModules) {
    bool bRes = true;
    pLogger = gnilk::Logger::GetLogger("TestModExeSeq");

    // Convert to vector and sort..
    std::vector<TestModule::Ref> testModulesList;
    for(auto &[k,v] : testModules) {
        testModulesList.push_back(v);
    }
    std::sort(testModulesList.begin(), testModulesList.end(), [](const TestModule::Ref &a, const TestModule::Ref &b) {
        return (a->name < b->name);
    });


    // For every argument on the command line
    for(auto argModuleName : Config::Instance().modules) {
        // Match cases
        std::vector<TestModule::Ref> matches;
        auto matchResult = ModuleMatch(matches, argModuleName, testModulesList);
        // In case this is negative (i.e. don't execute) we remove it from the sorted LOCAL list
        // NOTE: DO NOT change the state - if can be that another module depends on this one - in that case we need to execute...
        if (matchResult == kMatchResult::NegativeSingle) {
            assert(matches.size() == 1);
            auto tmToRemove = matches[0];
            // Remove this from the execution list...
            std::erase_if(testModulesList,[tmToRemove](const TestModule::Ref &m)->bool{
               return (tmToRemove->name == m->name);
            });
            continue;
        }

        // If here, we should execute anything in the matches list...
        for(auto &testModule : matches) {
            // Already executed?
            if (!testModule->IsIdle()) {
                //pLogger->Debug("Tests for '%s' already executed, skipping",testModule->name.c_str());
                continue;
            }

            pLogger->Info("Executing tests for library: %s", testModule->name.c_str());

            TestRunner::SetCurrentTestModule(testModule);
            auto result = testModule->Execute(library);
            if ((result != nullptr) && (result->CheckIfContinue() == TestResult::kRunResultAction::kAbortAll)) {
                break;
            }
            TestRunner::SetCurrentTestModule(nullptr);
        } // for modules

    }

    return bRes;
}